

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

void cfd::api::json::DecodePsbtInput::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> func_table;
  allocator local_f9;
  undefined1 local_f8 [48];
  code *local_c8;
  code *local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_f8._8_8_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_f8._0_8_ = GetNon_witness_utxo_hexString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetNon_witness_utxo_hexString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_b8 = GetNon_witness_utxo_hexFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[21],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [21])"non_witness_utxo_hex",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"non_witness_utxo_hex",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetNon_witness_utxoString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetNon_witness_utxoString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetNon_witness_utxoFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[17],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [17])"non_witness_utxo",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"non_witness_utxo",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetWitness_utxoString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetWitness_utxoString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetWitness_utxoFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])0x501248,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"witness_utxo",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetPartial_signaturesString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetPartial_signaturesString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetPartial_signaturesFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[19],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [19])"partial_signatures",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"partial_signatures",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetSighashString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetSighashString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetSighashFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])"sighash",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"sighash",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetRedeem_scriptString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetRedeem_scriptString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetRedeem_scriptFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])0x440498,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"redeem_script",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetWitness_scriptString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetWitness_scriptString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetWitness_scriptFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[15],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [15])"witness_script",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"witness_script",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetBip32_derivsString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetBip32_derivsString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetBip32_derivsFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])"bip32_derivs",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"bip32_derivs",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetFinal_scriptsigString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetFinal_scriptsigString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetFinal_scriptsigFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"final_scriptsig",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"final_scriptsig",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetFinal_scriptwitnessString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetFinal_scriptwitnessString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetFinal_scriptwitnessFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[20],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [20])"final_scriptwitness",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"final_scriptwitness",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetUnknownString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodePsbtInput_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodePsbtInput_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetUnknownString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodePsbtInput_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetUnknownFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])0x50110a,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"unknown",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtInput> *)&local_98);
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}